

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deTimer.c
# Opt level: O1

deBool deTimer_scheduleSingle(deTimer *timer,int milliseconds)

{
  int iVar1;
  deBool dVar2;
  itimerspec local_38;
  
  dVar2 = 0;
  if (timer->isActive == 0) {
    local_38.it_value.tv_sec = (__time_t)(milliseconds / 1000);
    local_38.it_value.tv_nsec = (long)((milliseconds % 1000) * 1000);
    local_38.it_interval.tv_sec = 0;
    local_38.it_interval.tv_nsec = 0;
    dVar2 = 0;
    iVar1 = timer_settime(timer->timer,0,&local_38,(itimerspec *)0x0);
    if (iVar1 == 0) {
      timer->isActive = 1;
      dVar2 = 1;
    }
  }
  return dVar2;
}

Assistant:

deBool deTimer_scheduleSingle (deTimer* timer, int milliseconds)
{
	struct itimerspec tspec;

	DE_ASSERT(timer && milliseconds > 0);

	if (timer->isActive)
		return DE_FALSE;

	tspec.it_value.tv_sec		= milliseconds / 1000;
	tspec.it_value.tv_nsec		= (milliseconds % 1000) * 1000;
	tspec.it_interval.tv_sec	= 0;
	tspec.it_interval.tv_nsec	= 0;

	if (timer_settime(timer->timer, 0, &tspec, DE_NULL) != 0)
		return DE_FALSE;

	timer->isActive = DE_TRUE;
	return DE_TRUE;
}